

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O0

EffectStateFactory * getFactoryByType(ALenum type)

{
  FactoryItem *pFVar1;
  FactoryItem *pFVar2;
  undefined4 in_EDI;
  FactoryItem *iter;
  EffectStateFactory *local_30;
  FactoryItem *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  anon_class_4_1_89923c38_for__M_pred __pred;
  FactoryItem *pFVar3;
  
  __pred.type = (ALenum)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  std::begin<(anonymous_namespace)::FactoryItem_const,17ul>
            ((FactoryItem (*) [17])(anonymous_namespace)::FactoryList);
  std::end<(anonymous_namespace)::FactoryItem_const,17ul>
            ((FactoryItem (*) [17])(anonymous_namespace)::FactoryList);
  pFVar1 = std::find_if<(anonymous_namespace)::FactoryItem_const*,getFactoryByType(int)::__0>
                     ((FactoryItem *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,__pred);
  pFVar3 = pFVar1;
  pFVar2 = std::end<(anonymous_namespace)::FactoryItem_const,17ul>
                     ((FactoryItem (*) [17])(anonymous_namespace)::FactoryList);
  if (pFVar1 == pFVar2) {
    local_30 = (EffectStateFactory *)0x0;
  }
  else {
    local_30 = (*pFVar3->GetFactory)();
  }
  return local_30;
}

Assistant:

EffectStateFactory *getFactoryByType(ALenum type)
{
    auto iter = std::find_if(std::begin(FactoryList), std::end(FactoryList),
        [type](const FactoryItem &item) noexcept -> bool
        { return item.Type == type; }
    );
    return (iter != std::end(FactoryList)) ? iter->GetFactory() : nullptr;
}